

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.cpp
# Opt level: O0

void __thiscall Material::setAlbedoTexture(Material *this,string *filePath)

{
  undefined1 local_30 [32];
  string *filePath_local;
  Material *this_local;
  
  local_30._24_8_ = filePath;
  filePath_local = (string *)this;
  std::make_unique<fw::Texture,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::shared_ptr<fw::Texture>::shared_ptr<fw::Texture,std::default_delete<fw::Texture>,void>
            ((shared_ptr<fw::Texture> *)(local_30 + 8),
             (unique_ptr<fw::Texture,_std::default_delete<fw::Texture>_> *)local_30);
  setAlbedoTexture(this,(shared_ptr<fw::Texture> *)(local_30 + 8));
  std::shared_ptr<fw::Texture>::~shared_ptr((shared_ptr<fw::Texture> *)(local_30 + 8));
  std::unique_ptr<fw::Texture,_std::default_delete<fw::Texture>_>::~unique_ptr
            ((unique_ptr<fw::Texture,_std::default_delete<fw::Texture>_> *)local_30);
  return;
}

Assistant:

void Material::setAlbedoTexture(std::string filePath) {
    setAlbedoTexture(std::make_unique<fw::Texture>(filePath));
}